

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cc
# Opt level: O0

void __thiscall
tchecker::ite_expression_t::ite_expression_t
          (ite_expression_t *this,shared_ptr<const_tchecker::expression_t> *condition,
          shared_ptr<const_tchecker::expression_t> *then_value,
          shared_ptr<const_tchecker::expression_t> *else_value)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  shared_ptr<const_tchecker::expression_t> *else_value_local;
  shared_ptr<const_tchecker::expression_t> *then_value_local;
  shared_ptr<const_tchecker::expression_t> *condition_local;
  ite_expression_t *this_local;
  
  expression_t::expression_t((expression_t *)this);
  *(undefined ***)this = &PTR__ite_expression_t_00423738;
  *(undefined ***)this = &PTR__ite_expression_t_00423738;
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_condition,condition);
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_then_value,then_value);
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_else_value,else_value);
  peVar1 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_condition).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr ite_condition expression");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar1 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_then_value).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr then_value expression");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar1 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_else_value).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr else_value expression");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

ite_expression_t::ite_expression_t(std::shared_ptr<tchecker::expression_t const> const & condition,
                                   std::shared_ptr<tchecker::expression_t const> const & then_value,
                                   std::shared_ptr<tchecker::expression_t const> const & else_value)
    : _condition(condition), _then_value(then_value), _else_value(else_value)
{
  if (_condition.get() == nullptr)
    throw std::invalid_argument("nullptr ite_condition expression");
  if (_then_value.get() == nullptr)
    throw std::invalid_argument("nullptr then_value expression");
  if (_else_value.get() == nullptr)
    throw std::invalid_argument("nullptr else_value expression");
}